

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_client2.c
# Opt level: O1

int my_recv(void *ctx,uchar *buf,size_t len)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = my_recv_first_try;
  iVar2 = -0x6900;
  if ((my_recv_first_try == 1) && (iVar2 = mbedtls_net_recv(ctx,buf,len), iVar2 == -0x6900)) {
    return -0x6900;
  }
  my_recv_first_try = bVar1 ^ 1;
  return iVar2;
}

Assistant:

static int my_recv( void *ctx, unsigned char *buf, size_t len )
{
    static int first_try = 1;
    int ret;

    if( first_try )
    {
        first_try = 0;
        return( MBEDTLS_ERR_SSL_WANT_READ );
    }

    ret = mbedtls_net_recv( ctx, buf, len );
    if( ret != MBEDTLS_ERR_SSL_WANT_READ )
        first_try = 1; /* Next call will be a new operation */
    return( ret );
}